

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O3

void deserialize_node<_IO_FILE*,int,unsigned_int>
               (IsoTree *node,_IO_FILE **in,vector<char,_std::allocator<char>_> *buffer,
               bool diff_endian)

{
  uint8_t data_en;
  double data_doubles [6];
  size_t data_sizets [4];
  byte local_79;
  double local_78;
  double local_70;
  double dStack_68;
  double local_60;
  double dStack_58;
  double local_50;
  size_t local_48;
  size_t local_40;
  size_t sStack_38;
  size_t local_30;
  
  if (!interrupt_switch) {
    read_bytes<unsigned_char>(&local_79,1,in);
    node->col_type = (uint)local_79;
    read_bytes<int,int>(&node->chosen_cat,1,in,buffer,diff_endian);
    read_bytes<double>(&local_78,6,in);
    if (diff_endian) {
      swap_endianness<double>(&local_78,6);
    }
    node->num_split = local_78;
    node->pct_tree_left = local_70;
    node->score = dStack_68;
    node->range_low = local_60;
    node->range_high = dStack_58;
    node->remainder = local_50;
    read_bytes<unsigned_long,unsigned_int>(&local_48,4,in,buffer,diff_endian);
    node->col_num = local_48;
    node->tree_left = local_40;
    node->tree_right = sStack_38;
    read_bytes<signed_char>(&node->cat_split,local_30,in);
  }
  return;
}

Assistant:

void deserialize_node(IsoTree &node, itype &in, std::vector<char> &buffer, const bool diff_endian)
{
    if (interrupt_switch) return;

    uint8_t data_en;
    read_bytes<uint8_t>((void*)&data_en, (size_t)1, in);
    node.col_type = (ColType)data_en;

    read_bytes<int, saved_int_t>((void*)&node.chosen_cat, (size_t)1, in, buffer, diff_endian);

    double data_doubles[6];
    read_bytes<double, double>((void*)data_doubles, (size_t)6, in, buffer, diff_endian);
    node.num_split = data_doubles[0];
    node.pct_tree_left = data_doubles[1];
    node.score = data_doubles[2];
    node.range_low = data_doubles[3];
    node.range_high = data_doubles[4];
    node.remainder = data_doubles[5];

    size_t data_sizets[4];
    read_bytes<size_t, saved_size_t>((void*)data_sizets, (size_t)4, in, buffer, diff_endian);
    node.col_num = data_sizets[0];
    node.tree_left = data_sizets[1];
    node.tree_right = data_sizets[2];
    read_bytes<signed char, signed char>(node.cat_split, data_sizets[3], in, buffer, diff_endian);
}